

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall
soul::AST::QualifiedIdentifier::QualifiedIdentifier
          (QualifiedIdentifier *this,Context *c,IdentifierPath *path)

{
  pool_ptr<soul::AST::Expression> local_78;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_70;
  
  Expression::Expression(&this->super_Expression,QualifiedIdentifier,c,unknown);
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__QualifiedIdentifier_0032d9b0;
  (this->pathSections).
  super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pathSections).
  super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pathSections).
  super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pathPrefix).pathSections.items = (Identifier *)(this->pathPrefix).pathSections.space;
  (this->pathPrefix).pathSections.numActive = 0;
  (this->pathPrefix).pathSections.numAllocated = 8;
  ArrayWithPreallocation<soul::Identifier,_8UL>::ArrayWithPreallocation
            (&local_70,&path->pathSections);
  local_78.object = (Expression *)0x0;
  addToPath(this,(IdentifierPath *)&local_70,&local_78);
  ArrayWithPreallocation<soul::Identifier,_8UL>::clear(&local_70);
  return;
}

Assistant:

QualifiedIdentifier (const Context& c, IdentifierPath path)
            : Expression (ObjectType::QualifiedIdentifier, c, ExpressionKind::unknown)
        {
            addToPath (path, nullptr);
        }